

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void container_printf_as_uint32_array(container_t *c,uint8_t typecode,uint32_t base)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  char *__format;
  ulong uVar5;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,typecode);
  if (uVar4 == 4) {
    uVar4 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar4 != '\x03') {
    if ((uVar4 & 0xff) == 2) {
      array_container_printf_as_uint32_array((array_container_t *)c,base);
      return;
    }
    bVar3 = true;
    lVar2 = 0;
    do {
      for (uVar5 = *(ulong *)(((array_container_t *)c)->array + lVar2 * 4); uVar5 != 0;
          uVar5 = uVar5 & uVar5 - 1) {
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        __format = ",%u";
        if (bVar3) {
          __format = "%u";
          bVar3 = false;
        }
        printf(__format,(ulong)((int)lVar1 + base));
      }
      base = base + 0x40;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x400);
    return;
  }
  run_container_printf_as_uint32_array((run_container_t *)c,base);
  return;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}